

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_math.cpp
# Opt level: O2

void fm_inverseRT(float *matrix,float *pos,float *t)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  
  fVar1 = pos[1] - matrix[0xd];
  fVar2 = *pos - matrix[0xc];
  fVar3 = pos[2] - matrix[0xe];
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * matrix[1])),ZEXT416((uint)fVar2),
                           ZEXT416((uint)*matrix));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar3),ZEXT416((uint)matrix[2]));
  *t = auVar4._0_4_;
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * matrix[5])),ZEXT416((uint)fVar2),
                           ZEXT416((uint)matrix[4]));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar3),ZEXT416((uint)matrix[6]));
  t[1] = auVar4._0_4_;
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * matrix[9])),ZEXT416((uint)fVar2),
                           ZEXT416((uint)matrix[8]));
  auVar4 = vfmadd231ss_fma(auVar4,ZEXT416((uint)fVar3),ZEXT416((uint)matrix[10]));
  t[2] = auVar4._0_4_;
  return;
}

Assistant:

void fm_inverseRT(const float *matrix,const float *pos,float *t) // inverse rotate translate the point.
{

	float _x = pos[0] - matrix[3*4+0];
	float _y = pos[1] - matrix[3*4+1];
	float _z = pos[2] - matrix[3*4+2];

	// Multiply inverse-translated source vector by inverted rotation transform

	t[0] = (matrix[0*4+0] * _x) + (matrix[0*4+1] * _y) + (matrix[0*4+2] * _z);
	t[1] = (matrix[1*4+0] * _x) + (matrix[1*4+1] * _y) + (matrix[1*4+2] * _z);
	t[2] = (matrix[2*4+0] * _x) + (matrix[2*4+1] * _y) + (matrix[2*4+2] * _z);

}